

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_nbcd(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 dest;
  int reg0;
  int mode;
  uint mode_00;
  uintptr_t o;
  TCGv_i32 addr;
  
  tcg_ctx = s->uc->tcg_ctx;
  gen_flush_flags(s);
  mode_00 = insn >> 3 & 7;
  pTVar1 = gen_ea_mode(env,s,mode_00,insn & 7,0,tcg_ctx->NULL_QREG,&addr,EA_LOADU,
                       (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (pTVar1 != tcg_ctx->NULL_QREG) {
    dest = tcg_const_i32_m68k(tcg_ctx,0);
    bcd_sub(tcg_ctx,dest,pTVar1);
    pTVar1 = gen_ea_mode(env,s,mode_00,insn & 7,0,dest,&addr,EA_STORE,
                         (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
    if (pTVar1 != tcg_ctx->NULL_QREG) {
      bcd_flags(tcg_ctx,dest);
      tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(dest + (long)tcg_ctx));
      return;
    }
  }
  gen_exception(s,(s->base).pc_next,3);
  return;
}

Assistant:

DISAS_INSN(nbcd)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src, dest;
    TCGv addr;

    gen_flush_flags(s); /* !Z is sticky */

    SRC_EA(env, src, OS_BYTE, 0, &addr);

    dest = tcg_const_i32(tcg_ctx, 0);
    bcd_sub(tcg_ctx, dest, src);

    DEST_EA(env, insn, OS_BYTE, dest, &addr);

    bcd_flags(tcg_ctx, dest);

    tcg_temp_free(tcg_ctx, dest);
}